

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O0

void __thiscall
cmOSXBundleGenerator::CreateFramework(cmOSXBundleGenerator *this,string *targetName,string *outpath)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  cmGeneratorTarget *target;
  cmLocalGenerator *this_00;
  bool bVar2;
  char *pcVar3;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  _Self local_298;
  allocator local_289;
  key_type local_288;
  _Self local_268;
  _Self local_260;
  allocator local_251;
  key_type local_250;
  _Self local_230;
  _Self local_228;
  allocator local_219;
  key_type local_218;
  _Self local_1f8;
  string local_1f0 [8];
  string versions;
  string newName;
  string oldName;
  undefined1 local_188 [8];
  string name;
  allocator local_151;
  value_type local_150;
  string local_130 [8];
  string plist;
  string frameworkVersion;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string newoutpath;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string contentdir;
  string *outpath_local;
  string *targetName_local;
  cmOSXBundleGenerator *this_local;
  
  contentdir.field_2._8_8_ = outpath;
  bVar2 = MustSkip(this);
  if (!bVar2) {
    if (this->MacContentFolders ==
        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      __assert_fail("this->MacContentFolders",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmOSXBundleGenerator.cxx"
                    ,0x47,
                    "void cmOSXBundleGenerator::CreateFramework(const std::string &, const std::string &)"
                   );
    }
    std::operator+(&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   contentdir.field_2._8_8_,"/");
    cmGeneratorTarget::GetFrameworkDirectory(&local_80,this->GT,&this->ConfigName,ContentLevel);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::operator+=((string *)local_40,"/");
    std::operator+(&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   contentdir.field_2._8_8_,"/");
    cmGeneratorTarget::GetFrameworkDirectory
              ((string *)((long)&frameworkVersion.field_2 + 8),this->GT,&this->ConfigName,FullLevel)
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   &local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&frameworkVersion.field_2 + 8));
    std::__cxx11::string::~string((string *)(frameworkVersion.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_d0);
    cmGeneratorTarget::GetFrameworkVersion_abi_cxx11_((string *)((long)&plist.field_2 + 8),this->GT)
    ;
    std::__cxx11::string::string(local_130,(string *)local_b0);
    bVar2 = cmMakefile::PlatformIsAppleIos(this->Makefile);
    if (!bVar2) {
      psVar1 = this->MacContentFolders;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_150,"Resources",&local_151);
      pVar4 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(psVar1,&local_150);
      name.field_2._8_8_ = pVar4.first._M_node;
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      std::__cxx11::string::operator+=(local_130,"/Resources");
    }
    std::__cxx11::string::operator+=(local_130,"/Info.plist");
    cmsys::SystemTools::GetFilenameName((string *)local_188,targetName);
    target = this->GT;
    this_00 = this->LocalGenerator;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmLocalGenerator::GenerateFrameworkInfoPList(this_00,target,(string *)local_188,pcVar3);
    bVar2 = cmMakefile::PlatformIsAppleIos(this->Makefile);
    if (!bVar2) {
      std::__cxx11::string::string((string *)(newName.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(versions.field_2._M_local_buf + 8));
      std::__cxx11::string::string(local_1f0,(string *)local_40);
      std::__cxx11::string::operator+=(local_1f0,"Versions");
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmsys::SystemTools::MakeDirectory(pcVar3);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmsys::SystemTools::MakeDirectory(pcVar3);
      std::__cxx11::string::operator=
                ((string *)(newName.field_2._M_local_buf + 8),
                 (string *)(plist.field_2._M_local_buf + 8));
      std::__cxx11::string::operator=((string *)(versions.field_2._M_local_buf + 8),local_1f0);
      std::__cxx11::string::operator+=((string *)(versions.field_2._M_local_buf + 8),"/Current");
      cmsys::SystemTools::RemoveFile((string *)((long)&versions.field_2 + 8));
      cmsys::SystemTools::CreateSymlink
                ((string *)((long)&newName.field_2 + 8),(string *)((long)&versions.field_2 + 8));
      cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)((long)&versions.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)(newName.field_2._M_local_buf + 8),"Versions/Current/");
      std::__cxx11::string::operator+=
                ((string *)(newName.field_2._M_local_buf + 8),(string *)local_188);
      std::__cxx11::string::operator=
                ((string *)(versions.field_2._M_local_buf + 8),(string *)local_40);
      std::__cxx11::string::operator+=
                ((string *)(versions.field_2._M_local_buf + 8),(string *)local_188);
      cmsys::SystemTools::RemoveFile((string *)((long)&versions.field_2 + 8));
      cmsys::SystemTools::CreateSymlink
                ((string *)((long)&newName.field_2 + 8),(string *)((long)&versions.field_2 + 8));
      cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)((long)&versions.field_2 + 8));
      psVar1 = this->MacContentFolders;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_218,"Resources",&local_219);
      local_1f8._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(psVar1,&local_218);
      local_228._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this->MacContentFolders);
      bVar2 = std::operator!=(&local_1f8,&local_228);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      if (bVar2) {
        std::__cxx11::string::operator=
                  ((string *)(newName.field_2._M_local_buf + 8),"Versions/Current/Resources");
        std::__cxx11::string::operator=
                  ((string *)(versions.field_2._M_local_buf + 8),(string *)local_40);
        std::__cxx11::string::operator+=((string *)(versions.field_2._M_local_buf + 8),"Resources");
        cmsys::SystemTools::RemoveFile((string *)((long)&versions.field_2 + 8));
        cmsys::SystemTools::CreateSymlink
                  ((string *)((long)&newName.field_2 + 8),(string *)((long)&versions.field_2 + 8));
        cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)((long)&versions.field_2 + 8));
      }
      psVar1 = this->MacContentFolders;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_250,"Headers",&local_251);
      local_230._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(psVar1,&local_250);
      local_260._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this->MacContentFolders);
      bVar2 = std::operator!=(&local_230,&local_260);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
      if (bVar2) {
        std::__cxx11::string::operator=
                  ((string *)(newName.field_2._M_local_buf + 8),"Versions/Current/Headers");
        std::__cxx11::string::operator=
                  ((string *)(versions.field_2._M_local_buf + 8),(string *)local_40);
        std::__cxx11::string::operator+=((string *)(versions.field_2._M_local_buf + 8),"Headers");
        cmsys::SystemTools::RemoveFile((string *)((long)&versions.field_2 + 8));
        cmsys::SystemTools::CreateSymlink
                  ((string *)((long)&newName.field_2 + 8),(string *)((long)&versions.field_2 + 8));
        cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)((long)&versions.field_2 + 8));
      }
      psVar1 = this->MacContentFolders;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_288,"PrivateHeaders",&local_289);
      local_268._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(psVar1,&local_288);
      local_298._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this->MacContentFolders);
      bVar2 = std::operator!=(&local_268,&local_298);
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
      if (bVar2) {
        std::__cxx11::string::operator=
                  ((string *)(newName.field_2._M_local_buf + 8),"Versions/Current/PrivateHeaders");
        std::__cxx11::string::operator=
                  ((string *)(versions.field_2._M_local_buf + 8),(string *)local_40);
        std::__cxx11::string::operator+=
                  ((string *)(versions.field_2._M_local_buf + 8),"PrivateHeaders");
        cmsys::SystemTools::RemoveFile((string *)((long)&versions.field_2 + 8));
        cmsys::SystemTools::CreateSymlink
                  ((string *)((long)&newName.field_2 + 8),(string *)((long)&versions.field_2 + 8));
        cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)((long)&versions.field_2 + 8));
      }
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::string::~string((string *)(versions.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(newName.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::~string((string *)local_188);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string((string *)(plist.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateFramework(const std::string& targetName,
                                           const std::string& outpath)
{
  if (this->MustSkip()) {
    return;
  }

  assert(this->MacContentFolders);

  // Compute the location of the top-level foo.framework directory.
  std::string contentdir = outpath + "/" +
    this->GT->GetFrameworkDirectory(this->ConfigName,
                                    cmGeneratorTarget::ContentLevel);
  contentdir += "/";

  std::string newoutpath = outpath + "/" +
    this->GT->GetFrameworkDirectory(this->ConfigName,
                                    cmGeneratorTarget::FullLevel);

  std::string frameworkVersion = this->GT->GetFrameworkVersion();

  // Configure the Info.plist file
  std::string plist = newoutpath;
  if (!this->Makefile->PlatformIsAppleIos()) {
    // Put the Info.plist file into the Resources directory.
    this->MacContentFolders->insert("Resources");
    plist += "/Resources";
  }
  plist += "/Info.plist";
  std::string name = cmSystemTools::GetFilenameName(targetName);
  this->LocalGenerator->GenerateFrameworkInfoPList(this->GT, name,
                                                   plist.c_str());

  // Generate Versions directory only for MacOSX frameworks
  if (this->Makefile->PlatformIsAppleIos()) {
    return;
  }

  // TODO: Use the cmMakefileTargetGenerator::ExtraFiles vector to
  // drive rules to create these files at build time.
  std::string oldName;
  std::string newName;

  // Make foo.framework/Versions
  std::string versions = contentdir;
  versions += "Versions";
  cmSystemTools::MakeDirectory(versions.c_str());

  // Make foo.framework/Versions/version
  cmSystemTools::MakeDirectory(newoutpath.c_str());

  // Current -> version
  oldName = frameworkVersion;
  newName = versions;
  newName += "/Current";
  cmSystemTools::RemoveFile(newName);
  cmSystemTools::CreateSymlink(oldName, newName);
  this->Makefile->AddCMakeOutputFile(newName);

  // foo -> Versions/Current/foo
  oldName = "Versions/Current/";
  oldName += name;
  newName = contentdir;
  newName += name;
  cmSystemTools::RemoveFile(newName);
  cmSystemTools::CreateSymlink(oldName, newName);
  this->Makefile->AddCMakeOutputFile(newName);

  // Resources -> Versions/Current/Resources
  if (this->MacContentFolders->find("Resources") !=
      this->MacContentFolders->end()) {
    oldName = "Versions/Current/Resources";
    newName = contentdir;
    newName += "Resources";
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
  }

  // Headers -> Versions/Current/Headers
  if (this->MacContentFolders->find("Headers") !=
      this->MacContentFolders->end()) {
    oldName = "Versions/Current/Headers";
    newName = contentdir;
    newName += "Headers";
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
  }

  // PrivateHeaders -> Versions/Current/PrivateHeaders
  if (this->MacContentFolders->find("PrivateHeaders") !=
      this->MacContentFolders->end()) {
    oldName = "Versions/Current/PrivateHeaders";
    newName = contentdir;
    newName += "PrivateHeaders";
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
  }
}